

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatorprofile.cpp
# Opt level: O0

string * __thiscall
libcellml::GeneratorProfile::implementationComputeVariablesMethodString_abi_cxx11_
          (string *__return_storage_ptr__,GeneratorProfile *this,bool forDifferentialModel,
          bool withExternalVariables)

{
  bool withExternalVariables_local;
  bool forDifferentialModel_local;
  GeneratorProfile *this_local;
  
  if (forDifferentialModel) {
    if (withExternalVariables) {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,
                 (string *)&this->mPimpl->mImplementationComputeVariablesMethodFdmWevString);
    }
    else {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,
                 (string *)&this->mPimpl->mImplementationComputeVariablesMethodFdmWoevString);
    }
  }
  else if (withExternalVariables) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (string *)&this->mPimpl->mImplementationComputeVariablesMethodFamWevString);
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (string *)&this->mPimpl->mImplementationComputeVariablesMethodFamWoevString);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GeneratorProfile::implementationComputeVariablesMethodString(bool forDifferentialModel,
                                                                         bool withExternalVariables) const
{
    if (forDifferentialModel) {
        if (withExternalVariables) {
            return mPimpl->mImplementationComputeVariablesMethodFdmWevString;
        }

        return mPimpl->mImplementationComputeVariablesMethodFdmWoevString;
    }

    if (withExternalVariables) {
        return mPimpl->mImplementationComputeVariablesMethodFamWevString;
    }

    return mPimpl->mImplementationComputeVariablesMethodFamWoevString;
}